

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

bool __thiscall
GF2::MP<6ul,GF2::MOGrevlex<6ul>>::ModGB<GF2::MOGrevlex<6ul>>
          (MP<6ul,GF2::MOGrevlex<6ul>> *this,MP<6UL,_GF2::MOGrevlex<6UL>_> *polyRight)

{
  list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *plVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *plVar4;
  bool bVar5;
  MM<6UL> lm;
  MP<6UL,_GF2::MOGrevlex<6UL>_> poly;
  Geobucket<4UL> gb;
  WW<6UL> local_88;
  list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *local_80;
  list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *local_78;
  long local_70;
  Geobucket<4UL> local_60;
  
  MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<4UL>::Geobucket
            (&local_60,(MP<6UL,_GF2::MOGrevlex<6UL>_> *)this);
  std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::clear
            ((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)this);
  bVar5 = false;
  local_88._words[0] = (word  [1])0;
  local_70 = 0;
  local_80 = (list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *)&local_80;
  local_78 = (list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *)&local_80;
  while (bVar2 = MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<4UL>::PopLM
                           (&local_60,(MM<6UL> *)&local_88), plVar4 = local_80, bVar2) {
    p_Var3 = (polyRight->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
             super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
             super__List_node_base._M_next;
    if (((ulong)p_Var3[1]._M_next & ~(ulong)local_88._words[0]) == 0) {
      if ((list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *)&local_80 !=
          (list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *)polyRight) {
        std::__cxx11::list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>>::
        _M_assign_dispatch<std::_List_const_iterator<GF2::MM<6ul>>>
                  ((list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *)&local_80,p_Var3,polyRight);
      }
      plVar4 = local_80;
      local_70 = local_70 + -1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(plVar4,0x18);
      local_88._words[0] =
           (word  [1])
           (~(ulong)(polyRight->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
                    super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
                    super__List_node_base._M_next[1]._M_next & (ulong)local_88._words[0]);
      for (plVar4 = local_80; plVar4 != (list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *)&local_80
          ; plVar4 = *(list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> **)plVar4) {
        *(ulong *)(plVar4 + 0x10) = *(ulong *)(plVar4 + 0x10) | (ulong)local_88._words[0];
      }
      MP<6UL,_GF2::MOGrevlex<6UL>_>::Normalize((MP<6UL,_GF2::MOGrevlex<6UL>_> *)&local_80);
      bVar5 = true;
      MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<4UL>::SymDiffSplice
                (&local_60,(MP<6UL,_GF2::MOGrevlex<6UL>_> *)&local_80);
    }
    else {
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = (_List_node_base *)local_88._words[0];
      std::__detail::_List_node_base::_M_hook(p_Var3);
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    }
  }
  while (plVar4 != (list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *)&local_80) {
    plVar1 = *(list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> **)plVar4;
    operator_delete(plVar4,0x18);
    plVar4 = plVar1;
  }
  if (local_60._maxsizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60._maxsizes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60._maxsizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60._maxsizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>::
  ~vector(&local_60._buckets);
  return bVar5;
}

Assistant:

bool ModGB(const MP<_n, _O1>& polyRight)
	{	
		// поскольку операция выбора старшего монома задействована,
		// коэффициент роста geobucket выберем равным 4
		Geobucket<4> gb(*this);
		// будем сохранять в this остаток
		SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP poly(_order);
		while (gb.PopLM(lm))
			// делимость старших мономов?
			if (lm.IsDivisibleBy(polyRight.LM()))
			{
				changed = true;
				// готовим множитель
				(poly = polyRight).PopLM();
				// перемножаем и добавляем в geobucket
                gb.SymDiffSplice(poly *= (lm /= polyRight.LM()));
			}
			else
				// заносим lm в остаток
				push_back(lm);
		return changed;
	}